

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O1

int new_value(json_state *state,json_value **top,json_value **root,json_value **alloc,json_type type
             )

{
  json_type jVar1;
  ulong uVar2;
  json_value *pjVar3;
  unsigned_long uVar4;
  char *pcVar5;
  int iVar6;
  _json_value *p_Var7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (state->first_pass == 0) {
    pjVar3 = *alloc;
    *top = pjVar3;
    *alloc = (json_value *)(*alloc)->_reserved;
    if (*root == (json_value *)0x0) {
      *root = pjVar3;
    }
    jVar1 = pjVar3->type;
    if (jVar1 == json_object) {
      if ((pjVar3->u).boolean == 0) {
        return 1;
      }
      iVar6 = (pjVar3->u).boolean * 0x18;
      pcVar8 = (pjVar3->u).string.ptr + iVar6;
      uVar4 = state->used_memory;
      if (((char *)(state->ulong_max - uVar4) < pcVar8) ||
         ((pcVar5 = (char *)(state->settings).max_memory, pcVar5 != (char *)0x0 &&
          (state->used_memory = (unsigned_long)(pcVar8 + uVar4), pcVar5 < pcVar8 + uVar4)))) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar8 = (char *)(*(state->settings).mem_alloc)
                                   ((size_t)pcVar8,0,(state->settings).user_data);
      }
      (pjVar3->u).string.ptr = pcVar8;
      if (pcVar8 == (char *)0x0) {
        return 0;
      }
      (pjVar3->_reserved).next_alloc = (_json_value *)(pcVar8 + iVar6);
    }
    else {
      if (jVar1 == json_string) {
        uVar10 = (ulong)((pjVar3->u).boolean + 1);
      }
      else {
        if (jVar1 != json_array) {
          return 1;
        }
        uVar10 = (ulong)(pjVar3->u).string.length;
        if (uVar10 == 0) {
          return 1;
        }
        uVar10 = uVar10 << 3;
      }
      if ((state->ulong_max - state->used_memory < uVar10) ||
         ((uVar2 = (state->settings).max_memory, uVar2 != 0 &&
          (uVar9 = state->used_memory + uVar10, state->used_memory = uVar9, uVar2 < uVar9)))) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar8 = (char *)(*(state->settings).mem_alloc)(uVar10,0,(state->settings).user_data);
      }
      (pjVar3->u).string.ptr = pcVar8;
      if (pcVar8 == (char *)0x0) {
        return 0;
      }
    }
    (pjVar3->u).boolean = 0;
  }
  else {
    uVar10 = (state->settings).value_extra + 0x28;
    if ((state->ulong_max - state->used_memory < uVar10) ||
       ((uVar2 = (state->settings).max_memory, uVar2 != 0 &&
        (uVar9 = state->used_memory + uVar10, state->used_memory = uVar9, uVar2 < uVar9)))) {
      p_Var7 = (_json_value *)0x0;
    }
    else {
      p_Var7 = (_json_value *)(*(state->settings).mem_alloc)(uVar10,1,(state->settings).user_data);
    }
    if (p_Var7 == (_json_value *)0x0) {
      return 0;
    }
    if (*root == (json_value *)0x0) {
      *root = p_Var7;
    }
    p_Var7->type = type;
    p_Var7->parent = *top;
    if (*alloc != (json_value *)0x0) {
      ((*alloc)->_reserved).next_alloc = p_Var7;
    }
    *top = p_Var7;
    *alloc = p_Var7;
  }
  return 1;
}

Assistant:

static int new_value (json_state * state,
                      json_value ** top, json_value ** root, json_value ** alloc,
                      json_type type)
{
   json_value * value;
   int values_size;

   if (!state->first_pass)
   {
      value = *top = *alloc;
      *alloc = (*alloc)->_reserved.next_alloc;

      if (!*root)
         *root = value;

      switch (value->type)
      {
         case json_array:

            if (value->u.array.length == 0)
               break;

            if (! (value->u.array.values = (json_value **) json_alloc
               (state, value->u.array.length * sizeof (json_value *), 0)) )
            {
               return 0;
            }

            value->u.array.length = 0;
            break;

         case json_object:

            if (value->u.object.length == 0)
               break;

            values_size = sizeof (*value->u.object.values) * value->u.object.length;

            if (! (value->u.object.values = (json_object_entry *) json_alloc
                  (state, values_size + ((unsigned long) value->u.object.values), 0)) )
            {
               return 0;
            }

            value->_reserved.object_mem = (*(char **) &value->u.object.values) + values_size;

            value->u.object.length = 0;
            break;

         case json_string:

            if (! (value->u.string.ptr = (json_char *) json_alloc
               (state, (value->u.string.length + 1) * sizeof (json_char), 0)) )
            {
               return 0;
            }

            value->u.string.length = 0;
            break;

         default:
            break;
      };

      return 1;
   }

   if (! (value = (json_value *) json_alloc
         (state, sizeof (json_value) + state->settings.value_extra, 1)))
   {
      return 0;
   }

   if (!*root)
      *root = value;

   value->type = type;
   value->parent = *top;

   #ifdef JSON_TRACK_SOURCE
      value->line = state->cur_line;
      value->col = state->cur_col;
   #endif

   if (*alloc)
      (*alloc)->_reserved.next_alloc = value;

   *alloc = *top = value;

   return 1;
}